

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O3

int ssl_parse_certificate_verify(mbedtls_ssl_context *ssl)

{
  ulong uVar1;
  long lVar2;
  mbedtls_key_exchange_type_t mVar3;
  mbedtls_ssl_ciphersuite_t *pmVar4;
  int iVar5;
  mbedtls_md_type_t md_alg;
  mbedtls_pk_type_t type;
  int line;
  char *pcVar6;
  ulong uVar7;
  size_t hash_len;
  uchar *hash_00;
  uchar hash [48];
  uchar auStack_68 [16];
  uchar local_58 [40];
  
  hash_00 = auStack_68;
  pmVar4 = ssl->transform_negotiate->ciphersuite_info;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
             ,0xdee,"=> parse certificate verify");
  mVar3 = pmVar4->key_exchange;
  if (((mVar3 - MBEDTLS_KEY_EXCHANGE_PSK < 4) || (mVar3 == MBEDTLS_KEY_EXCHANGE_ECJPAKE)) ||
     (ssl->session_negotiate->peer_cert == (mbedtls_x509_crt *)0x0)) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xdf7,"<= skip parse certificate verify");
    ssl->state = ssl->state + 1;
    return 0;
  }
  do {
    iVar5 = mbedtls_ssl_read_record_layer(ssl);
    if (iVar5 != 0) {
      pcVar6 = "mbedtls_ssl_read_record_layer";
      line = 0xe01;
      goto LAB_001211a3;
    }
    iVar5 = mbedtls_ssl_handle_message_type(ssl);
  } while (iVar5 == -0x6680);
  if (iVar5 == 0) {
    ssl->state = ssl->state + 1;
    if ((ssl->in_msgtype != 0x16) || (*ssl->in_msg != '\x0f')) {
      pcVar6 = "bad certificate verify message";
      iVar5 = 0xe15;
      goto LAB_001211c8;
    }
    lVar2 = (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8;
    uVar7 = lVar2 + 4;
    if (ssl->minor_ver == 3) {
      if (ssl->in_hslen < (uVar7 | 2)) {
        pcVar6 = "bad certificate verify message";
        iVar5 = 0xe39;
        goto LAB_001211c8;
      }
      md_alg = mbedtls_ssl_md_alg_from_hash(ssl->in_msg[uVar7]);
      if ((md_alg == MBEDTLS_MD_NONE) ||
         (iVar5 = mbedtls_ssl_set_calc_verify_md(ssl,(uint)ssl->in_msg[uVar7]), iVar5 != 0)) {
        pcVar6 = "peer not adhering to requested sig_alg for verify message";
        iVar5 = 0xe45;
        goto LAB_001211c8;
      }
      type = mbedtls_ssl_pk_alg_from_sig(ssl->in_msg[lVar2 + 5]);
      if (type == MBEDTLS_PK_NONE) {
        pcVar6 = "peer not adhering to requested sig_alg for verify message";
        iVar5 = 0xe5a;
        goto LAB_001211c8;
      }
      iVar5 = mbedtls_pk_can_do(&ssl->session_negotiate->peer_cert->pk,type);
      if (iVar5 == 0) {
        pcVar6 = "sig_alg doesn\'t match cert key";
        iVar5 = 0xe63;
        goto LAB_001211c8;
      }
      hash_00 = auStack_68 + (ulong)(md_alg == MBEDTLS_MD_SHA1) * 0x10;
      hash_len = 0;
      uVar7 = uVar7 | 2;
    }
    else {
      md_alg = MBEDTLS_MD_SHA1;
      iVar5 = mbedtls_pk_can_do(&ssl->session_negotiate->peer_cert->pk,MBEDTLS_PK_ECDSA);
      if (iVar5 == 0) {
        md_alg = MBEDTLS_MD_NONE;
        hash_len = 0x24;
      }
      else {
        hash_len = 0x14;
        hash_00 = local_58;
      }
    }
    uVar1 = uVar7 + 2;
    if (ssl->in_hslen < uVar1) {
      pcVar6 = "bad certificate verify message";
      iVar5 = 0xe72;
    }
    else {
      uVar7 = (ulong)(ushort)(*(ushort *)(ssl->in_msg + uVar7) << 8 |
                             *(ushort *)(ssl->in_msg + uVar7) >> 8);
      if (uVar1 + uVar7 == ssl->in_hslen) {
        (*ssl->handshake->calc_verify)(ssl,auStack_68);
        iVar5 = mbedtls_pk_verify(&ssl->session_negotiate->peer_cert->pk,md_alg,hash_00,hash_len,
                                  ssl->in_msg + uVar1,uVar7);
        if (iVar5 == 0) {
          mbedtls_ssl_update_handshake_status(ssl);
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                     ,0xe8c,"<= parse certificate verify");
          return 0;
        }
        pcVar6 = "mbedtls_pk_verify";
        line = 0xe86;
        goto LAB_001211a3;
      }
      pcVar6 = "bad certificate verify message";
      iVar5 = 0xe7b;
    }
LAB_001211c8:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,iVar5,pcVar6);
    return -0x7d80;
  }
  pcVar6 = "mbedtls_ssl_handle_message_type";
  line = 0xe0b;
LAB_001211a3:
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
             ,line,pcVar6,iVar5);
  return iVar5;
}

Assistant:

static int ssl_parse_certificate_verify( mbedtls_ssl_context *ssl )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    size_t i, sig_len;
    unsigned char hash[48];
    unsigned char *hash_start = hash;
    size_t hashlen;
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
    mbedtls_pk_type_t pk_alg;
#endif
    mbedtls_md_type_t md_alg;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse certificate verify" ) );

    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE ||
        ssl->session_negotiate->peer_cert == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate verify" ) );
        ssl->state++;
        return( 0 );
    }

    /* Read the message without adding it to the checksum */
    do {

        if( ( ret = mbedtls_ssl_read_record_layer( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, ( "mbedtls_ssl_read_record_layer" ), ret );
            return( ret );
        }

        ret = mbedtls_ssl_handle_message_type( ssl );

    } while( MBEDTLS_ERR_SSL_NON_FATAL == ret );

    if( 0 != ret )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, ( "mbedtls_ssl_handle_message_type" ), ret );
        return( ret );
    }

    ssl->state++;

    /* Process the message contents */
    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE ||
        ssl->in_msg[0] != MBEDTLS_SSL_HS_CERTIFICATE_VERIFY )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate verify message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_VERIFY );
    }

    i = mbedtls_ssl_hs_hdr_len( ssl );

    /*
     *  struct {
     *     SignatureAndHashAlgorithm algorithm; -- TLS 1.2 only
     *     opaque signature<0..2^16-1>;
     *  } DigitallySigned;
     */
#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
    if( ssl->minor_ver != MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        md_alg = MBEDTLS_MD_NONE;
        hashlen = 36;

        /* For ECDSA, use SHA-1, not MD-5 + SHA-1 */
        if( mbedtls_pk_can_do( &ssl->session_negotiate->peer_cert->pk,
                        MBEDTLS_PK_ECDSA ) )
        {
            hash_start += 16;
            hashlen -= 16;
            md_alg = MBEDTLS_MD_SHA1;
        }
    }
    else
#endif /* MBEDTLS_SSL_PROTO_SSL3 || MBEDTLS_SSL_PROTO_TLS1 ||
          MBEDTLS_SSL_PROTO_TLS1_1 */
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        if( i + 2 > ssl->in_hslen )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate verify message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_VERIFY );
        }

        /*
         * Hash
         */
        md_alg = mbedtls_ssl_md_alg_from_hash( ssl->in_msg[i] );

        if( md_alg == MBEDTLS_MD_NONE || mbedtls_ssl_set_calc_verify_md( ssl, ssl->in_msg[i] ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "peer not adhering to requested sig_alg"
                                " for verify message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_VERIFY );
        }

#if !defined(MBEDTLS_MD_SHA1)
        if( MBEDTLS_MD_SHA1 == md_alg )
            hash_start += 16;
#endif

        /* Info from md_alg will be used instead */
        hashlen = 0;

        i++;

        /*
         * Signature
         */
        if( ( pk_alg = mbedtls_ssl_pk_alg_from_sig( ssl->in_msg[i] ) )
                        == MBEDTLS_PK_NONE )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "peer not adhering to requested sig_alg"
                                " for verify message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_VERIFY );
        }

        /*
         * Check the certificate's key type matches the signature alg
         */
        if( ! mbedtls_pk_can_do( &ssl->session_negotiate->peer_cert->pk, pk_alg ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "sig_alg doesn't match cert key" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_VERIFY );
        }

        i++;
    }
    else
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    if( i + 2 > ssl->in_hslen )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate verify message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_VERIFY );
    }

    sig_len = ( ssl->in_msg[i] << 8 ) | ssl->in_msg[i+1];
    i += 2;

    if( i + sig_len != ssl->in_hslen )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate verify message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_VERIFY );
    }

    /* Calculate hash and verify signature */
    ssl->handshake->calc_verify( ssl, hash );

    if( ( ret = mbedtls_pk_verify( &ssl->session_negotiate->peer_cert->pk,
                           md_alg, hash_start, hashlen,
                           ssl->in_msg + i, sig_len ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_pk_verify", ret );
        return( ret );
    }

    mbedtls_ssl_update_handshake_status( ssl );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse certificate verify" ) );

    return( ret );
}